

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::extractCap(MembraneCapTableBuilder *this,uint index)

{
  ClientHook *pCVar1;
  ClientHook *extraout_RDX;
  ClientHook *pCVar2;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  undefined4 in_register_00000034;
  long lVar3;
  Own<capnp::ClientHook> OVar4;
  Maybe<kj::Own<capnp::ClientHook>_> MVar5;
  Disposer *local_48;
  ClientHook *local_40;
  Own<capnp::ClientHook> local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  lVar3 = CONCAT44(in_register_00000034,index);
  (**(code **)**(undefined8 **)(lVar3 + 8))(&local_48);
  if (local_40 == (ClientHook *)0x0) {
    (this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
    this->inner = (CapTableBuilder *)0x0;
    pCVar2 = extraout_RDX;
  }
  else {
    local_38.disposer = local_48;
    local_38.ptr = local_40;
    local_40 = (ClientHook *)0x0;
    OVar4 = membrane((anon_unknown_0 *)&local_28,&local_38,*(MembranePolicy **)(lVar3 + 0x10),
                     *(bool *)(lVar3 + 0x18));
    pCVar2 = OVar4.ptr;
    if (local_38.ptr != (ClientHook *)0x0) {
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 (local_38.ptr)->_vptr_ClientHook[-2] + (long)&(local_38.ptr)->_vptr_ClientHook);
      pCVar2 = extraout_RDX_00;
    }
    pCVar1 = local_40;
    *(undefined4 *)&(this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader =
         local_28;
    *(undefined4 *)
     ((long)&(this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader + 4) =
         uStack_24;
    *(undefined4 *)&this->inner = uStack_20;
    *(undefined4 *)((long)&this->inner + 4) = uStack_1c;
    if (local_40 != (ClientHook *)0x0) {
      local_40 = (ClientHook *)0x0;
      (**local_48->_vptr_Disposer)(local_48,(long)pCVar1 + *(long *)(*(long *)pCVar1 + -0x10));
      pCVar2 = extraout_RDX_01;
    }
  }
  MVar5.ptr.ptr = pCVar2;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> extractCap(uint index) override {
    // The underlying message is inside the membrane, and we're pulling a cap out of it. Therefore,
    // we want to wrap the extracted capability in the membrane.
    return inner->extractCap(index).map([this](kj::Own<ClientHook>&& cap) {
      return membrane(kj::mv(cap), policy, reverse);
    });
  }